

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O0

void __thiscall Messages::Person::InternalSwap(Person *this,Person *other)

{
  bool bVar1;
  undefined1 *this_00;
  Container<google::protobuf::UnknownFieldSet> *pCVar2;
  string *psVar3;
  Arena *pAVar4;
  string *psVar5;
  Person *other_local;
  Person *this_local;
  UnknownFieldSet *local_a0;
  string *other_ptr_1;
  string *this_ptr_1;
  string *other_ptr;
  string *this_ptr;
  
  this_00 = &other->field_0x8;
  if ((((uint)*(undefined8 *)&this->field_0x8 & 1) == 1) ||
     (((uint)*(undefined8 *)this_00 & 1) == 1)) {
    if (((uint)*(undefined8 *)this_00 & 1) == 1) {
      pCVar2 = google::protobuf::internal::InternalMetadata::
               PtrValue<google::protobuf::internal::InternalMetadata::Container<google::protobuf::UnknownFieldSet>>
                         ((InternalMetadata *)this_00);
      local_a0 = &pCVar2->unknown_fields;
    }
    else {
      local_a0 = google::protobuf::internal::InternalMetadata::
                 mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>
                           ((InternalMetadata *)this_00);
    }
    google::protobuf::internal::InternalMetadata::DoSwap<google::protobuf::UnknownFieldSet>
              ((InternalMetadata *)&this->field_0x8,local_a0);
  }
  std::swap<unsigned_int>((this->_has_bits_).has_bits_,(other->_has_bits_).has_bits_);
  google::protobuf::RepeatedPtrField<Messages::Person_PhoneNumber>::InternalSwap
            (&this->phones_,&other->phones_);
  psVar3 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  pAVar4 = google::protobuf::MessageLite::GetArena((MessageLite *)this);
  bVar1 = google::protobuf::internal::ArenaStringPtr::IsDefault(&this->name_,psVar3);
  if ((!bVar1) ||
     (bVar1 = google::protobuf::internal::ArenaStringPtr::IsDefault(&other->name_,psVar3), !bVar1))
  {
    psVar5 = google::protobuf::internal::ArenaStringPtr::Mutable(&this->name_,psVar3,pAVar4);
    google::protobuf::internal::ArenaStringPtr::Mutable(&other->name_,psVar3,pAVar4);
    std::__cxx11::string::swap((string *)psVar5);
  }
  psVar3 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  pAVar4 = google::protobuf::MessageLite::GetArena((MessageLite *)this);
  bVar1 = google::protobuf::internal::ArenaStringPtr::IsDefault(&this->email_,psVar3);
  if ((!bVar1) ||
     (bVar1 = google::protobuf::internal::ArenaStringPtr::IsDefault(&other->email_,psVar3), !bVar1))
  {
    psVar5 = google::protobuf::internal::ArenaStringPtr::Mutable(&this->email_,psVar3,pAVar4);
    google::protobuf::internal::ArenaStringPtr::Mutable(&other->email_,psVar3,pAVar4);
    std::__cxx11::string::swap((string *)psVar5);
  }
  std::swap<int>(&this->id_,&other->id_);
  return;
}

Assistant:

void Person::InternalSwap(Person* other) {
  using std::swap;
  _internal_metadata_.Swap<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  phones_.InternalSwap(&other->phones_);
  name_.Swap(&other->name_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  email_.Swap(&other->email_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  swap(id_, other->id_);
}